

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_mct_data_group
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_tcp_t *poVar2;
  OPJ_BOOL OVar3;
  opj_tcp_t *l_tcp;
  opj_mct_data_t *l_mct_record;
  opj_simple_mcc_decorrelation_data_t *l_mcc_record;
  OPJ_UINT32 i;
  opj_event_mgr *p_manager_local;
  opj_stream_private *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x14af,
                  "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream != (opj_stream_private *)0x0) {
    if (p_manager == (opj_event_mgr *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x14b1,
                    "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                   );
    }
    OVar3 = opj_j2k_write_cbd(p_j2k,p_stream,p_manager);
    if (OVar3 == 0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      poVar2 = (p_j2k->m_cp).tcps;
      uVar1 = p_j2k->m_current_tile_number;
      l_tcp = (opj_tcp_t *)poVar2[uVar1].m_mct_records;
      for (l_mcc_record._4_4_ = 0; l_mcc_record._4_4_ < poVar2[uVar1].m_nb_mct_records;
          l_mcc_record._4_4_ = l_mcc_record._4_4_ + 1) {
        OVar3 = opj_j2k_write_mct_record(p_j2k,(opj_mct_data_t *)l_tcp,p_stream,p_manager);
        if (OVar3 == 0) {
          return 0;
        }
        l_tcp = (opj_tcp_t *)(l_tcp->rates + 3);
      }
      l_mct_record = (opj_mct_data_t *)poVar2[uVar1].m_mcc_records;
      for (l_mcc_record._4_4_ = 0; l_mcc_record._4_4_ < poVar2[uVar1].m_nb_mcc_records;
          l_mcc_record._4_4_ = l_mcc_record._4_4_ + 1) {
        OVar3 = opj_j2k_write_mcc_record
                          (p_j2k,(opj_simple_mcc_decorrelation_data *)l_mct_record,p_stream,
                           p_manager);
        if (OVar3 == 0) {
          return 0;
        }
        l_mct_record = l_mct_record + 1;
      }
      OVar3 = opj_j2k_write_mco(p_j2k,p_stream,p_manager);
      if (OVar3 == 0) {
        p_j2k_local._4_4_ = 0;
      }
      else {
        p_j2k_local._4_4_ = 1;
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x14b0,
                "OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_mct_data_group(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 i;
    opj_simple_mcc_decorrelation_data_t * l_mcc_record;
    opj_mct_data_t * l_mct_record;
    opj_tcp_t * l_tcp;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    if (! opj_j2k_write_cbd(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_j2k->m_current_tile_number]);
    l_mct_record = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {

        if (! opj_j2k_write_mct_record(p_j2k, l_mct_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mct_record;
    }

    l_mcc_record = l_tcp->m_mcc_records;

    for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {

        if (! opj_j2k_write_mcc_record(p_j2k, l_mcc_record, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        ++l_mcc_record;
    }

    if (! opj_j2k_write_mco(p_j2k, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}